

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnsetCommand.cxx
# Opt level: O3

bool __thiscall
cmUnsetCommand::InitialPass
          (cmUnsetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string *psVar4;
  ulong uVar5;
  string local_48;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((name == psVar4) || (uVar5 = (long)psVar4 - (long)name >> 5, 2 < uVar5)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_48);
LAB_0029a9de:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
  }
  else {
    iVar2 = strncmp((name->_M_dataplus)._M_p,"ENV{",4);
    if ((iVar2 == 0) && (5 < name->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)name);
      cmSystemTools::UnsetEnv(local_48._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else if (uVar5 == 2) {
      iVar2 = std::__cxx11::string::compare((char *)(name + 1));
      if (iVar2 != 0) {
        psVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        psVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        goto LAB_0029aaa0;
      }
      cmMakefile::RemoveCacheDefinition((this->super_cmCommand).Makefile,name);
    }
    else {
      psVar3 = name;
      if (uVar5 == 1) {
        cmMakefile::RemoveDefinition((this->super_cmCommand).Makefile,name);
      }
      else {
LAB_0029aaa0:
        if (((long)psVar4 - (long)psVar3 != 0x40) ||
           (iVar2 = std::__cxx11::string::compare((char *)(psVar3 + 1)), iVar2 != 0)) {
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"called with an invalid second argument","");
          cmCommand::SetError(&this->super_cmCommand,&local_48);
          goto LAB_0029a9de;
        }
        cmMakefile::RaiseScope((this->super_cmCommand).Makefile,name,(char *)0x0);
      }
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmUnsetCommand::InitialPass(std::vector<std::string> const& args,
                                 cmExecutionStatus&)
{
  if (args.empty() || args.size() > 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  auto const& variable = args[0];

  // unset(ENV{VAR})
  if (cmHasLiteralPrefix(variable, "ENV{") && variable.size() > 5) {
    // what is the variable name
    auto const& envVarName = variable.substr(4, variable.size() - 5);

#ifdef CMAKE_BUILD_WITH_CMAKE
    cmSystemTools::UnsetEnv(envVarName.c_str());
#endif
    return true;
  }
  // unset(VAR)
  if (args.size() == 1) {
    this->Makefile->RemoveDefinition(variable);
    return true;
  }
  // unset(VAR CACHE)
  if ((args.size() == 2) && (args[1] == "CACHE")) {
    this->Makefile->RemoveCacheDefinition(variable);
    return true;
  }
  // unset(VAR PARENT_SCOPE)
  if ((args.size() == 2) && (args[1] == "PARENT_SCOPE")) {
    this->Makefile->RaiseScope(variable, nullptr);
    return true;
  }
  // ERROR: second argument isn't CACHE or PARENT_SCOPE
  this->SetError("called with an invalid second argument");
  return false;
}